

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O3

void __thiscall
Memory::HeapPageAllocator<Memory::PreReservedVirtualAllocWrapper>::ReleaseDecommittedSegment
          (HeapPageAllocator<Memory::PreReservedVirtualAllocWrapper> *this,
          SegmentBase<Memory::PreReservedVirtualAllocWrapper> *segment)

{
  size_t *psVar1;
  undefined4 *puVar2;
  size_t sVar3;
  PageMemoryData *pPVar4;
  code *pcVar5;
  bool bVar6;
  undefined8 *in_FS_OFFSET;
  undefined1 in_XMM1 [16];
  undefined1 auVar7 [16];
  
  bVar6 = PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
          ::ValidThreadAccess(&this->
                               super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                             );
  if (!bVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0xa20,"(this->ValidThreadAccess())",
                       "Page allocation should only be used by a single thread");
    if (!bVar6) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar2 = 0;
  }
  sVar3 = segment->segmentPageCount;
  psVar1 = &(this->
            super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
            ).reservedBytes;
  *psVar1 = *psVar1 + sVar3 * -0x1000;
  psVar1 = &(this->
            super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
            ).numberOfSegments;
  *psVar1 = *psVar1 - 1;
  pPVar4 = (this->
           super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
           ).memoryData;
  if (pPVar4 != (PageMemoryData *)0x0) {
    auVar7 = pmovsxbq(in_XMM1,0x101);
    pPVar4->releaseSegmentCount = auVar7._0_8_ + pPVar4->releaseSegmentCount;
    pPVar4->releaseSegmentBytes = sVar3 * 0x1000 + pPVar4->releaseSegmentBytes;
  }
  DListBase<Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
  RemoveElement<Memory::NoThrowHeapAllocator>
            (&(this->
              super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
              ).largeSegments,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance,segment);
  return;
}

Assistant:

void
HeapPageAllocator<T>::ReleaseDecommittedSegment(__in SegmentBase<T>* segment)
{
    ASSERT_THREAD();

    this->LogFreeDecommittedSegment(segment);
    this->largeSegments.RemoveElement(&NoThrowNoMemProtectHeapAllocator::Instance, segment);
}